

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes128.c
# Opt level: O0

int aead_aes128gcm_setup_crypto(ptls_aead_context_t *ctx,int is_enc,void *key,void *iv)

{
  int iVar1;
  void *iv_local;
  void *key_local;
  int is_enc_local;
  ptls_aead_context_t *ctx_local;
  
  iVar1 = aead_aesgcm_setup_crypto(ctx,is_enc,key,iv);
  return iVar1;
}

Assistant:

static int aead_aes128gcm_setup_crypto(ptls_aead_context_t *ctx, int is_enc, const void *key, const void *iv)
{
    return aead_aesgcm_setup_crypto(ctx, is_enc, key, iv);
}